

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<Statement,_std::default_delete<Statement>_> __thiscall Parser::single(Parser *this)

{
  TokenStream *pTVar1;
  logic_error *this_00;
  undefined *puVar2;
  undefined8 *in_RSI;
  long lVar3;
  Token token;
  Token TStack_58;
  Token local_40;
  
  TokenStream::next(&local_40,(TokenStream *)*in_RSI);
  if (Minus < local_40.type) {
switchD_001074a0_caseD_4:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Bad input.");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((0xccU >> (local_40.type & 0x1f) & 1) == 0) {
    if (local_40.type != Dot) {
      if (local_40.type != Comma) goto switchD_001074a0_caseD_4;
      goto switchD_001074a0_caseD_1;
    }
switchD_001074a0_caseD_0:
    pTVar1 = (TokenStream *)operator_new(8);
    puVar2 = &PrintStatement::vtable;
LAB_001074e6:
    *(undefined **)&(pTVar1->supplier).super__Function_base._M_functor = puVar2 + 0x10;
  }
  else {
    TokenStream::lookahead(&TStack_58,(TokenStream *)*in_RSI);
    lVar3 = 1;
    while (TStack_58.type == local_40.type) {
      TokenStream::next(&TStack_58,(TokenStream *)*in_RSI);
      lVar3 = lVar3 + 1;
      TokenStream::lookahead(&TStack_58,(TokenStream *)*in_RSI);
    }
    switch(local_40.type) {
    case Dot:
      goto switchD_001074a0_caseD_0;
    case Comma:
switchD_001074a0_caseD_1:
      pTVar1 = (TokenStream *)operator_new(8);
      puVar2 = &InputStatement::vtable;
      goto LAB_001074e6;
    case LeftAngledBracket:
      pTVar1 = (TokenStream *)operator_new(0x10);
      puVar2 = &ShiftLeftStatement::vtable;
      break;
    case RightAngledBracket:
      pTVar1 = (TokenStream *)operator_new(0x10);
      puVar2 = &ShiftRightStatement::vtable;
      break;
    default:
      goto switchD_001074a0_caseD_4;
    case Plus:
      pTVar1 = (TokenStream *)operator_new(0x10);
      puVar2 = &IncrementStatement::vtable;
      break;
    case Minus:
      pTVar1 = (TokenStream *)operator_new(0x10);
      puVar2 = &DecrementStatement::vtable;
    }
    *(undefined **)&(pTVar1->supplier).super__Function_base._M_functor = puVar2 + 0x10;
    *(long *)((long)&(pTVar1->supplier).super__Function_base._M_functor + 8) = lVar3;
  }
  this->tokenStream = pTVar1;
  return (__uniq_ptr_data<Statement,_std::default_delete<Statement>,_true,_true>)
         (__uniq_ptr_data<Statement,_std::default_delete<Statement>,_true,_true>)this;
}

Assistant:

auto Parser::single() -> std::unique_ptr<Statement> {
    auto token = tokenStream.next();
    auto type = token.type;

    if (type == TokenKind::LeftAngledBracket || type == TokenKind::RightAngledBracket || type == TokenKind::Plus || type == TokenKind::Minus) {
        long long by = 1;
        while (tokenStream.lookahead().type == type) {
            tokenStream.next();
            by++;
        }

        switch (type) {
            case TokenKind::LeftAngledBracket:
                return std::make_unique<ShiftLeftStatement>(by);
            case TokenKind::RightAngledBracket:
                return std::make_unique<ShiftRightStatement>(by);
            case TokenKind::Plus:
                return std::make_unique<IncrementStatement>(by);
            case TokenKind::Minus:
                return std::make_unique<DecrementStatement>(by);
        }
    }

    switch (type) {
        case TokenKind::Dot:
            return std::make_unique<PrintStatement>();
        case TokenKind::Comma:
            return std::make_unique<InputStatement>();
        default: throw std::logic_error("Bad input."); // TODO: Improve message
    }
}